

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BG_FactorGraphCreator.cpp
# Opt level: O0

void __thiscall
BG_FactorGraphCreator::Construct_AgentTypePair_Variables(BG_FactorGraphCreator *this)

{
  int iVar1;
  type pBVar2;
  ulong uVar3;
  undefined4 extraout_var;
  size_t sVar4;
  reference pvVar5;
  ostream *poVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  allocator_type *paVar7;
  undefined4 extraout_var_02;
  shared_ptr<const_BayesianGameCollaborativeGraphical> *in_RDI;
  Var v;
  Index tI;
  Index agI_2;
  Index atI;
  Index agI_1;
  Index agI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes;
  size_t nrATs;
  size_t in_stack_fffffffffffffe98;
  BayesianGameBase *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffeb0;
  size_type in_stack_fffffffffffffeb8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_fffffffffffffed0;
  Var local_60;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  ulong local_10;
  
  pBVar2 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
  (*(pBVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
    super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::resize(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  local_10 = 0;
  pBVar2 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
  (*(pBVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
    super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
    _vptr_Interface_ProblemToPolicyDiscrete[3])();
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x89a921);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffec0,
             in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x89a94d);
  local_40 = 0;
  while( true ) {
    uVar3 = (ulong)local_40;
    pBVar2 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
    iVar1 = (*(pBVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
    if (CONCAT44(extraout_var,iVar1) <= uVar3) break;
    boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
    sVar4 = BayesianGameBase::GetNrTypes
                      (in_stack_fffffffffffffea0,(Index)(in_stack_fffffffffffffe98 >> 0x20));
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_28,(ulong)local_40);
    *pvVar5 = sVar4;
    if (1 < *(int *)&in_RDI[6].pn.pi_) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Agent ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_40);
      poVar6 = std::operator<<(poVar6," has ");
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&local_28,(ulong)local_40);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*pvVar5);
      poVar6 = std::operator<<(poVar6," types.");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_28,(ulong)local_40);
    local_10 = local_10 + *pvVar5;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&in_RDI[1].pn,(ulong)local_40);
    boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
    BayesianGameBase::GetNrTypes
              (in_stack_fffffffffffffea0,(Index)(in_stack_fffffffffffffe98 >> 0x20));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
    local_40 = local_40 + 1;
  }
  if (0 < *(int *)&in_RDI[6].pn.pi_) {
    poVar6 = std::operator<<((ostream *)&std::cout,"FactorGraph has ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_10);
    poVar6 = std::operator<<(poVar6," variables (agent-types)");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  local_44 = 0;
  while( true ) {
    uVar3 = (ulong)local_44;
    pBVar2 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
    iVar1 = (*(pBVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
    if (CONCAT44(extraout_var_00,iVar1) <= uVar3) break;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)&in_RDI[1].pn,(ulong)local_44);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&local_28,(ulong)local_44);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffec8);
    local_44 = local_44 + 1;
  }
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::reserve
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  local_48 = 0;
  local_4c = 0;
  while( true ) {
    uVar3 = (ulong)local_4c;
    pBVar2 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
    iVar1 = (*(pBVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
              super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
              _vptr_Interface_ProblemToPolicyDiscrete[3])();
    if (CONCAT44(extraout_var_01,iVar1) <= uVar3) break;
    local_50 = 0;
    while( true ) {
      paVar7 = (allocator_type *)(ulong)local_50;
      boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
      in_stack_fffffffffffffeb0 =
           (allocator_type *)
           BayesianGameBase::GetNrTypes
                     (in_stack_fffffffffffffea0,(Index)(in_stack_fffffffffffffe98 >> 0x20));
      if (in_stack_fffffffffffffeb0 <= paVar7) break;
      in_stack_fffffffffffffea0 = (BayesianGameBase *)(ulong)local_48;
      pBVar2 = boost::shared_ptr<const_BayesianGameCollaborativeGraphical>::operator->(in_RDI);
      iVar1 = (*(pBVar2->super_BayesianGameIdenticalPayoffInterface).super_BayesianGameBase.
                super_Interface_ProblemToPolicyDiscretePure.super_Interface_ProblemToPolicyDiscrete.
                _vptr_Interface_ProblemToPolicyDiscrete[4])(pBVar2,(ulong)local_4c);
      in_stack_fffffffffffffe98 = CONCAT44(extraout_var_02,iVar1);
      libDAI::Var::Var(&local_60,(long)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&in_RDI[1].pn,(ulong)local_4c);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffeb0,
                 (value_type_conflict1 *)pBVar2);
      std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::push_back
                ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)in_stack_fffffffffffffeb0,
                 (value_type *)pBVar2);
      local_48 = local_48 + 1;
      local_50 = local_50 + 1;
    }
    local_4c = local_4c + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void BG_FactorGraphCreator::Construct_AgentTypePair_Variables()
{    
    _m_var_indices.resize( _m_bg->GetNrAgents() );
    size_t nrATs=0;
    vector<size_t> nrTypes(_m_bg->GetNrAgents() );
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
    {
        nrTypes[agI] =  _m_bg->GetNrTypes(agI);
        if(_m_verbosity >= 2)
            cout << "Agent "<<agI<<" has " << nrTypes[agI] << " types."<<endl;
        nrATs += nrTypes[agI];
        _m_var_indices[agI].reserve( _m_bg->GetNrTypes(agI) );
    }
    if(_m_verbosity >= 1)
        cout << "FactorGraph has "<<nrATs<<" variables (agent-types)"<<endl;
   
    //reserve memory 
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
        _m_var_indices[agI].reserve( nrTypes[agI] );
    _m_vars.reserve(nrATs);

    Index atI = 0;
    for(Index agI = 0; agI < _m_bg->GetNrAgents(); agI++)
        for(Index tI = 0; tI < _m_bg->GetNrTypes(agI); tI++)
        {
            //Note variables for higher agents have higher indices!
            libDAI::Var v(atI, _m_bg->GetNrActions(agI));
            _m_var_indices[agI].push_back(atI);
            _m_vars.push_back(v);
            atI++;
        }

}